

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_0,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  long lVar1;
  Vector<float,_3> res;
  undefined8 local_38;
  float local_30;
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  local_20 = DAT_0078b358._4_4_ + -1.0 + s_constInMat2._4_4_ + -1.0;
  local_28 = CONCAT44((float)DAT_0078b358 + -1.0,(float)s_constInMat2 + -1.0);
  local_38 = CONCAT44((float)DAT_0078b358 + -1.0,(float)s_constInMat2 + -1.0);
  local_30 = local_20;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         *(float *)((long)&local_28 + lVar1 * 4) + *(float *)((long)&local_38 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}